

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

void amrex::VisMF::AsyncWrite(FabArray<amrex::FArrayBox> *mf,string *mf_name,bool valid_cells_only)

{
  bool bVar1;
  FabFactory<amrex::FArrayBox> local_1c8;
  MFInfo local_1c0;
  FabArray<amrex::FArrayBox> mf_tmp;
  
  bVar1 = AsyncOut::UseAsyncOut();
  if (bVar1) {
    AsyncWriteDoit(mf,mf_name,true,valid_cells_only);
    return;
  }
  if ((valid_cells_only) &&
     ((*(long *)(mf->super_FabArrayBase).n_grow.vect != 0 ||
      ((mf->super_FabArrayBase).n_grow.vect[2] != 0)))) {
    local_1c0.alloc = true;
    local_1c0._1_7_ = 0;
    local_1c0.arena = (Arena *)0x0;
    local_1c0.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c0.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c0.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
    FabArray<amrex::FArrayBox>::FabArray
              (&mf_tmp,&(mf->super_FabArrayBase).boxarray,&(mf->super_FabArrayBase).distributionMap,
               (mf->super_FabArrayBase).n_comp,0,&local_1c0,&local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    Copy<amrex::FArrayBox,void>(&mf_tmp,mf,0,0,(mf->super_FabArrayBase).n_comp,0);
    Write(&mf_tmp,mf_name,NFiles,false);
    FabArray<amrex::FArrayBox>::~FabArray(&mf_tmp);
    return;
  }
  Write(mf,mf_name,NFiles,false);
  return;
}

Assistant:

void
VisMF::AsyncWrite (FabArray<FArrayBox>&& mf, const std::string& mf_name, bool valid_cells_only)
{
    if (AsyncOut::UseAsyncOut()) {
        AsyncWriteDoit(mf, mf_name, true, valid_cells_only);
    } else {
        if (valid_cells_only && mf.nGrowVect() != 0) {
            FabArray<FArrayBox> mf_tmp(mf.boxArray(), mf.DistributionMap(), mf.nComp(), 0);
            amrex::Copy(mf_tmp, mf, 0, 0, mf.nComp(), 0);
            Write(mf_tmp, mf_name);
        } else {
            Write(mf, mf_name);
        }
    }
}